

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O0

void __thiscall
booster::locale::basic_format<char>::add(basic_format<char> *this,formattible_type *param)

{
  formattible<char> *in_RSI;
  value_type *in_RDI;
  vector<booster::locale::details::formattible<char>,_std::allocator<booster::locale::details::formattible<char>_>_>
  *unaff_retaddr;
  
  if (*(uint *)&in_RDI[0x12].writer_ < 8) {
    details::formattible<char>::operator=
              ((formattible<char> *)&in_RDI[(ulong)*(uint *)&in_RDI[0x12].writer_ + 10].writer_,
               in_RSI);
  }
  else {
    std::
    vector<booster::locale::details::formattible<char>,_std::allocator<booster::locale::details::formattible<char>_>_>
    ::push_back(unaff_retaddr,in_RDI);
  }
  *(int *)&in_RDI[0x12].writer_ = *(int *)&in_RDI[0x12].writer_ + 1;
  return;
}

Assistant:

void add(formattible_type const &param)
            {
                if(parameters_count_ >= base_params_)
                    ext_params_.push_back(param);
                else 
                    parameters_[parameters_count_] = param;
                parameters_count_++;
            }